

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  long lVar1;
  ExplicitAnsiPortSyntax *pEVar2;
  Token *unaff_retaddr;
  Token *in_stack_00000008;
  Token *in_stack_00000010;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000018;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000020;
  ExpressionSyntax **in_stack_00000040;
  Token *in_stack_00000048;
  BumpAllocator *in_stack_000000b8;
  Token *in_stack_000000c0;
  BumpAllocator *in_stack_ffffffffffffff68;
  ExpressionSyntax *in_stack_ffffffffffffff70;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>
            (in_stack_00000020,(BumpAllocator *)in_stack_00000018);
  parsing::Token::deepClone(in_stack_000000c0,in_stack_000000b8);
  parsing::Token::deepClone(in_stack_000000c0,in_stack_000000b8);
  parsing::Token::deepClone(in_stack_000000c0,in_stack_000000b8);
  parsing::Token::deepClone(in_stack_000000c0,in_stack_000000b8);
  lVar1._0_2_ = ((Token *)((long)__fn + 0x90))->kind;
  lVar1._2_1_ = ((Token *)((long)__fn + 0x90))->field_0x2;
  lVar1._3_1_ = ((Token *)((long)__fn + 0x90))->numFlags;
  lVar1._4_4_ = ((Token *)((long)__fn + 0x90))->rawLen;
  if (lVar1 != 0) {
    deepClone<slang::syntax::ExpressionSyntax>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  parsing::Token::deepClone(in_stack_000000c0,in_stack_000000b8);
  pEVar2 = BumpAllocator::
           emplace<slang::syntax::ExplicitAnsiPortSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token>
                     ((BumpAllocator *)in_stack_00000020,in_stack_00000018,in_stack_00000010,
                      in_stack_00000008,unaff_retaddr,(Token *)__fn,in_stack_00000040,
                      in_stack_00000048);
  return (int)pEVar2;
}

Assistant:

static SyntaxNode* clone(const ExplicitAnsiPortSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ExplicitAnsiPortSyntax>(
        *deepClone(node.attributes, alloc),
        node.direction.deepClone(alloc),
        node.dot.deepClone(alloc),
        node.name.deepClone(alloc),
        node.openParen.deepClone(alloc),
        node.expr ? deepClone(*node.expr, alloc) : nullptr,
        node.closeParen.deepClone(alloc)
    );
}